

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O2

real_t __thiscall xLearn::AUCMetric::GetMetric(AUCMetric *this)

{
  real_t rVar1;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_20;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_20,
             &this->all_positive_number_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38,
             &this->all_negative_number_);
  rVar1 = CalcAUC(this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_20,
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_20);
  return rVar1;
}

Assistant:

real_t GetMetric() {
    return CalcAUC(all_positive_number_, 
                   all_negative_number_);
  }